

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

void mtbdd_fprintdot_nc(FILE *out,MTBDD mtbdd)

{
  fwrite("digraph \"DD\" {\n",0xf,1,(FILE *)out);
  fwrite("graph [dpi = 300];\n",0x13,1,(FILE *)out);
  fwrite("center = true;\n",0xf,1,(FILE *)out);
  fwrite("edge [dir = forward];\n",0x16,1,(FILE *)out);
  fwrite("root [style=invis];\n",0x14,1,(FILE *)out);
  fprintf((FILE *)out,"root -> %lu [style=solid];\n",mtbdd);
  mtbdd_fprintdot_nc_rec(out,mtbdd);
  mtbdd_unmark_rec(mtbdd);
  fwrite("}\n",2,1,(FILE *)out);
  return;
}

Assistant:

void
mtbdd_fprintdot_nc(FILE *out, MTBDD mtbdd)
{
    fprintf(out, "digraph \"DD\" {\n");
    fprintf(out, "graph [dpi = 300];\n");
    fprintf(out, "center = true;\n");
    fprintf(out, "edge [dir = forward];\n");
    fprintf(out, "root [style=invis];\n");
    fprintf(out, "root -> %" PRIu64 " [style=solid];\n", mtbdd);

    mtbdd_fprintdot_nc_rec(out, mtbdd);
    mtbdd_unmark_rec(mtbdd);

    fprintf(out, "}\n");
}